

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_PROJECT_LOS(effect_handler_context_t *context)

{
  wchar_t typ;
  loc finish;
  _Bool _Var1;
  wchar_t dam;
  wchar_t wVar2;
  loc grid1;
  monster *pmVar3;
  wchar_t idx;
  source origin;
  source sVar4;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,context->other != L'\0')
  ;
  typ = context->subtype;
  sVar4._4_4_ = 0;
  sVar4.what = (context->origin).what;
  sVar4.which.trap = (context->origin).which.trap;
  grid1 = origin_get_loc(sVar4);
  idx = L'\x01';
  while( true ) {
    wVar2 = cave_monster_max(cave);
    if (wVar2 <= idx) break;
    pmVar3 = cave_monster(cave,idx);
    if ((pmVar3->race != (monster_race *)0x0) && (pmVar3->midx != cave->mon_current)) {
      _Var1 = los(cave,(loc_conflict)grid1,pmVar3->grid);
      if (_Var1) {
        sVar4 = source_player();
        finish.x = (pmVar3->grid).x;
        finish.y = (pmVar3->grid).y;
        origin._4_4_ = 0;
        origin.what = sVar4.what;
        origin.which.trap = sVar4.which.trap;
        project(origin,L'\0',finish,dam,typ,L'Á',L'\0','\0',context->obj);
        context->ident = true;
      }
    }
    idx = idx + L'\x01';
  }
  return true;
}

Assistant:

bool effect_handler_PROJECT_LOS(effect_handler_context_t *context)
{
	int i;
	int dam = effect_calculate_value(context, context->other ? true : false);
	int typ = context->subtype;
	struct loc origin = origin_get_loc(context->origin);
	int flg = PROJECT_JUMP | PROJECT_KILL | PROJECT_HIDE;

	/* Affect all (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Don't affect the caster */
		if (mon->midx == cave->mon_current) continue;

		/* Require line of sight */
		if (!los(cave, origin, mon->grid)) continue;

		/* Jump directly to the monster */
		(void)project(source_player(), 0, mon->grid, dam, typ, flg, 0, 0,
					  context->obj);
		context->ident = true;
	}

	/* Result */
	return true;
}